

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall
duckdb_re2::Regexp::Walker<duckdb_re2::Regexp_*>::Reset(Walker<duckdb_re2::Regexp_*> *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  LogMessage *in_RDI;
  char *in_stack_fffffffffffffe48;
  LogMessage *in_stack_fffffffffffffe50;
  LogMessage local_188;
  
  bVar1 = std::
          stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
          ::empty((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                   *)0x852305);
  if (!bVar1) {
    LogMessage::LogMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0);
    poVar2 = LogMessage::stream(&local_188);
    std::operator<<(poVar2,"Stack not empty.");
    LogMessage::~LogMessage(in_RDI);
    while (bVar1 = std::
                   stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                   ::empty((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                            *)0x85235b), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::
               stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
               ::top((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                      *)0x852371);
      if (1 < pvVar3->re->nsub_) {
        pvVar3 = std::
                 stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                 ::top((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
                        *)0x85238b);
        if (pvVar3->child_args != (Regexp **)0x0) {
          operator_delete__(pvVar3->child_args);
        }
      }
      std::
      stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
      ::pop((stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
             *)0x8523ce);
    }
  }
  return;
}

Assistant:

void Regexp::Walker<T>::Reset() {
  if (!stack_.empty()) {
    LOG(DFATAL) << "Stack not empty.";
    while (!stack_.empty()) {
      if (stack_.top().re->nsub_ > 1)
        delete[] stack_.top().child_args;
      stack_.pop();
    }
  }
}